

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O3

int __thiscall
FNodeBuilder::OutputDegenerateSubsector
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          int subsector,bool bForward,double lastdot,FPrivSeg **prev,vertex_t *outVerts)

{
  FPrivSeg *pFVar1;
  side_t **ppsVar2;
  sector_t_conflict **ppsVar3;
  double dVar4;
  bool bVar5;
  DWORD DVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  subsector_t *psVar12;
  FPrivVert *pFVar13;
  glseg_t *pgVar14;
  DWORD DVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  FPrivSeg *pFVar20;
  int iVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  psVar12 = (this->Subsectors).Array;
  DVar6 = psVar12[subsector].numlines;
  iVar7 = (int)psVar12[subsector].firstline;
  iVar17 = DVar6 + iVar7;
  iVar19 = iVar7 + 1;
  iVar21 = 0;
  if (iVar19 < iVar17) {
    pFVar20 = (this->Segs).Array + (this->SegList).Array[iVar7].SegNum;
    pFVar13 = (this->Vertices).Array;
    dVar23 = (double)pFVar13[pFVar20->v1].super_FSimpleVert.x;
    dVar24 = (double)pFVar13[pFVar20->v1].super_FSimpleVert.y;
    iVar7 = pFVar13[pFVar20->v2].super_FSimpleVert.x;
    iVar8 = pFVar13[pFVar20->v2].super_FSimpleVert.y;
    bVar5 = pFVar20->planefront;
    dVar4 = OutputDegenerateSubsector::bestinit[bForward];
    lVar16 = (long)iVar19;
    iVar21 = 0;
    do {
      pFVar13 = (this->Vertices).Array;
      lVar18 = 0;
      pFVar20 = (FPrivSeg *)0x0;
      dVar25 = dVar4;
      do {
        pFVar1 = (this->Segs).Array + (this->SegList).Array[lVar16 + lVar18].SegNum;
        if (pFVar1->planefront == (bVar5 != !bForward)) {
          dVar22 = ((double)pFVar13[pFVar1->v1].super_FSimpleVert.y - dVar24) *
                   ((double)iVar8 - dVar24) +
                   ((double)pFVar13[pFVar1->v1].super_FSimpleVert.x - dVar23) *
                   ((double)iVar7 - dVar23);
          if (bForward) {
            if ((dVar22 < dVar25) && (lastdot < dVar22)) {
LAB_003aa138:
              pFVar20 = pFVar1;
              dVar25 = dVar22;
            }
          }
          else if ((dVar25 < dVar22) && (dVar22 < lastdot)) goto LAB_003aa138;
        }
        lVar18 = lVar18 + 1;
      } while (DVar6 - 1 != (int)lVar18);
      if (pFVar20 != (FPrivSeg *)0x0) {
        iVar9 = (*prev)->v2;
        iVar10 = pFVar20->v1;
        if (iVar9 != iVar10) {
          TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Grow(segs,1);
          pgVar14 = segs->Array;
          uVar11 = segs->Count;
          pgVar14[uVar11].super_seg_t.v1 = outVerts + iVar9;
          pgVar14[uVar11].super_seg_t.v2 = outVerts + iVar10;
          ppsVar2 = &pgVar14[uVar11].super_seg_t.sidedef;
          *ppsVar2 = (side_t *)0x0;
          ppsVar2[1] = (side_t *)0x0;
          ppsVar3 = &pgVar14[uVar11].super_seg_t.frontsector;
          *ppsVar3 = (sector_t_conflict *)0x0;
          ppsVar3[1] = (sector_t_conflict *)0x0;
          pgVar14[uVar11].Partner = 0xffffffff;
          segs->Count = segs->Count + 1;
          iVar21 = iVar21 + 1;
        }
        DVar15 = PushGLSeg(this,segs,pFVar20,outVerts);
        pFVar1->storedseg = DVar15;
        iVar21 = iVar21 + 1;
        *prev = pFVar20;
        lastdot = dVar25;
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 != iVar17);
  }
  return iVar21;
}

Assistant:

int FNodeBuilder::OutputDegenerateSubsector (TArray<glseg_t> &segs, int subsector, bool bForward, double lastdot, FPrivSeg *&prev, vertex_t *outVerts)
{
	static const double bestinit[2] = { -DBL_MAX, DBL_MAX };
	FPrivSeg *seg;
	int i, j, first, max, count;
	double dot, x1, y1, dx, dy, dx2, dy2;
	bool wantside;

	first = (DWORD)(size_t)Subsectors[subsector].firstline;
	max = first + Subsectors[subsector].numlines;
	count = 0;

	seg = &Segs[SegList[first].SegNum];
	x1 = Vertices[seg->v1].x;
	y1 = Vertices[seg->v1].y;
	dx = Vertices[seg->v2].x - x1;
	dy = Vertices[seg->v2].y - y1;
	wantside = seg->planefront ^ !bForward;

	for (i = first + 1; i < max; ++i)
	{
		double bestdot = bestinit[bForward];
		FPrivSeg *bestseg = NULL;
		for (j = first + 1; j < max; ++j)
		{
			seg = &Segs[SegList[j].SegNum];
			if (seg->planefront != wantside)
			{
				continue;
			}
			dx2 = Vertices[seg->v1].x - x1;
			dy2 = Vertices[seg->v1].y - y1;
			dot = dx*dx2 + dy*dy2;

			if (bForward)
			{
				if (dot < bestdot && dot > lastdot)
				{
					bestdot = dot;
					bestseg = seg;
				}
			}
			else
			{
				if (dot > bestdot && dot < lastdot)
				{
					bestdot = dot;
					bestseg = seg;
				}
			}
		}
		if (bestseg != NULL)
		{
			if (prev->v2 != bestseg->v1)
			{
				PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[bestseg->v1]);
				count++;
			}
			seg->storedseg = PushGLSeg (segs, bestseg, outVerts);
			count++;
			prev = bestseg;
			lastdot = bestdot;
		}
	}
	return count;
}